

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_dbl_errorfn(arg_dbl *parent,FILE *fp,int errorcode,char *argval,char *progname)

{
  char *shortopts_00;
  char *longopts_00;
  char *datatype_00;
  char *local_50;
  char *datatype;
  char *longopts;
  char *shortopts;
  char *progname_local;
  char *argval_local;
  int errorcode_local;
  FILE *fp_local;
  arg_dbl *parent_local;
  
  shortopts_00 = (parent->hdr).shortopts;
  longopts_00 = (parent->hdr).longopts;
  datatype_00 = (parent->hdr).datatype;
  local_50 = argval;
  if (argval == (char *)0x0) {
    local_50 = "";
  }
  fprintf((FILE *)fp,"%s: ",progname);
  if (errorcode == 1) {
    fputs("missing option ",(FILE *)fp);
    arg_print_option(fp,shortopts_00,longopts_00,datatype_00,"\n");
  }
  else if (errorcode == 2) {
    fputs("excess option ",(FILE *)fp);
    arg_print_option(fp,shortopts_00,longopts_00,local_50,"\n");
  }
  else if (errorcode == 5) {
    fprintf((FILE *)fp,"invalid argument \"%s\" to option ",local_50);
    arg_print_option(fp,shortopts_00,longopts_00,datatype_00,"\n");
  }
  return;
}

Assistant:

static void arg_dbl_errorfn(
	struct arg_dbl * parent,
	FILE * fp,
	int errorcode,
	const char * argval,
	const char * progname) {
	const char * shortopts = parent->hdr.shortopts;
	const char * longopts  = parent->hdr.longopts;
	const char * datatype  = parent->hdr.datatype;

	/* make argval NULL safe */
	argval = argval ? argval : "";

	fprintf(fp, "%s: ", progname);

	switch (errorcode) {
		case EMINCOUNT:
			fputs("missing option ", fp);
			arg_print_option(fp, shortopts, longopts, datatype, "\n");
			break;

		case EMAXCOUNT:
			fputs("excess option ", fp);
			arg_print_option(fp, shortopts, longopts, argval, "\n");
			break;

		case EBADDOUBLE:
			fprintf(fp, "invalid argument \"%s\" to option ", argval);
			arg_print_option(fp, shortopts, longopts, datatype, "\n");
			break;
	}
}